

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

future_result<rest_rpc::req_result> * __thiscall
rest_rpc::rpc_client::async_call<(rest_rpc::CallModel)0,person>
          (rpc_client *this,string *rpc_name,person *args)

{
  uint32_t uVar1;
  rpc_client *in_RSI;
  future_result<rest_rpc::req_result> *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>,_false,_false>,_bool>
  pVar2;
  buffer_type ret;
  msgpack_codec codec;
  unique_lock<std::mutex> lock;
  uint64_t fu_id;
  future<rest_rpc::req_result> future;
  shared_ptr<std::promise<rest_rpc::req_result>_> p;
  promise<rest_rpc::req_result> *in_stack_ffffffffffffff18;
  future<rest_rpc::req_result> *__uf;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar3;
  unsigned_long *in_stack_ffffffffffffff28;
  future_result<rest_rpc::req_result> *this_00;
  person *args_00;
  undefined1 local_b0 [56];
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>,_false>
  local_78;
  undefined1 local_70;
  future<rest_rpc::req_result> *local_58;
  person local_30;
  
  args_00 = &local_30;
  this_00 = in_RDI;
  std::make_shared<std::promise<rest_rpc::req_result>>();
  std::
  __shared_ptr_access<std::promise<rest_rpc::req_result>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::promise<rest_rpc::req_result>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1f693d);
  std::promise<rest_rpc::req_result>::get_future(in_stack_ffffffffffffff18);
  local_58 = (future<rest_rpc::req_result> *)0x0;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (mutex_type *)in_stack_ffffffffffffff18);
  in_RSI->fu_id_ = in_RSI->fu_id_ + 1;
  local_58 = (future<rest_rpc::req_result> *)in_RSI->fu_id_;
  pVar2 = std::
          unordered_map<unsigned_long,std::shared_ptr<std::promise<rest_rpc::req_result>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::promise<rest_rpc::req_result>>>>>
          ::emplace<unsigned_long&,std::shared_ptr<std::promise<rest_rpc::req_result>>>
                    ((unordered_map<unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>_>_>
                      *)this_00,in_stack_ffffffffffffff28,
                     (shared_ptr<std::promise<rest_rpc::req_result>_> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_78._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::promise<rest_rpc::req_result>_>_>,_false>
       ._M_cur;
  local_70 = pVar2.second;
  uVar3 = CONCAT13(local_70,(int3)in_stack_ffffffffffffff24);
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT44(uVar3,in_stack_ffffffffffffff20));
  rpc_service::msgpack_codec::msgpack_codec((msgpack_codec *)0x1f69eb);
  rpc_service::msgpack_codec::pack_args<person>(args_00);
  __uf = local_58;
  std::__cxx11::string::data();
  uVar1 = MD5::MD5Hash32((char *)CONCAT44(uVar3,in_stack_ffffffffffffff20));
  write(in_RSI,(int)__uf,(void *)0x0,(size_t)local_b0);
  this_00->id = (uint64_t)local_58;
  std::future<rest_rpc::req_result>::future
            ((future<rest_rpc::req_result> *)CONCAT44(uVar3,uVar1),__uf);
  msgpack::v1::sbuffer::~sbuffer((sbuffer *)0x1f6a6f);
  rpc_service::msgpack_codec::~msgpack_codec((msgpack_codec *)0x1f6a79);
  std::future<rest_rpc::req_result>::~future((future<rest_rpc::req_result> *)0x1f6a86);
  std::shared_ptr<std::promise<rest_rpc::req_result>_>::~shared_ptr
            ((shared_ptr<std::promise<rest_rpc::req_result>_> *)0x1f6a93);
  return in_RDI;
}

Assistant:

future_result<req_result> async_call(const std::string &rpc_name,
                                       Args &&...args) {
    auto p = std::make_shared<std::promise<req_result>>();
    std::future<req_result> future = p->get_future();

    uint64_t fu_id = 0;
    {
      std::unique_lock<std::mutex> lock(cb_mtx_);
      fu_id_++;
      fu_id = fu_id_;
      future_map_.emplace(fu_id, std::move(p));
    }

    rpc_service::msgpack_codec codec;
    auto ret = codec.pack_args(std::forward<Args>(args)...);
    write(fu_id, request_type::req_res, std::move(ret),
          MD5::MD5Hash32(rpc_name.data()));
    return future_result<req_result>{fu_id, std::move(future)};
  }